

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::FunctionMocker<void_(int,_int)>::PerformAction
          (FunctionMocker<void_(int,_int)> *this,void *untyped_action,ArgumentTuple *args,
          string *call_description)

{
  Action<void_(int,_int)> action;
  _Tuple_impl<0UL,_int,_int> local_38;
  function<void_(int,_int)> local_30;
  
  if (untyped_action != (void *)0x0) {
    std::function<void_(int,_int)>::function(&local_30,(function<void_(int,_int)> *)untyped_action);
    local_38 = args->super__Tuple_impl<0UL,_int,_int>;
    Action<void_(int,_int)>::Perform
              ((Action<void_(int,_int)> *)&local_30,(ArgumentTuple *)&local_38);
    std::_Function_base::~_Function_base(&local_30.super__Function_base);
    return;
  }
  PerformDefaultAction(this,args,call_description);
  return;
}

Assistant:

R PerformAction(const void* untyped_action, ArgumentTuple&& args,
                  const std::string& call_description) const {
    if (untyped_action == nullptr) {
      return PerformDefaultAction(std::move(args), call_description);
    }

    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    return action.Perform(std::move(args));
  }